

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderDepthRangeTest::ShaderDepthRangeTest
          (ShaderDepthRangeTest *this,Context *context,char *name,char *desc,bool isVertexCase)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  bool isVertexCase_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  ShaderDepthRangeTest *this_local;
  
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderDepthRangeTest_015939a0;
  testCtx = Context::getTestContext(context);
  renderCtx = Context::getRenderContext(context);
  ctxInfo = Context::getContextInfo(context);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,name,desc,isVertexCase,
             &(this->m_evaluator).super_ShaderEvaluator);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderDepthRangeTest_015939a0;
  anon_unknown_3::DepthRangeParams::DepthRangeParams(&this->m_depthRange);
  anon_unknown_3::DepthRangeEvaluator::DepthRangeEvaluator(&this->m_evaluator,&this->m_depthRange);
  this->m_iterNdx = 0;
  return;
}

Assistant:

ShaderDepthRangeTest (Context& context, const char* name, const char* desc, bool isVertexCase)
		: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, desc, isVertexCase, m_evaluator)
		, m_evaluator		(m_depthRange)
		, m_iterNdx			(0)
	{
	}